

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

Vec_Int_t * Abc_NtkDelayTraceSlackStart(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  int local_28;
  int local_24;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vSlacks;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkObjNumMax(pNtk);
  iVar2 = Abc_NtkGetTotalFanins(pNtk);
  p = Vec_IntAlloc(iVar1 + iVar2);
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Vec_IntFill(p,iVar1,-1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkObj(pNtk,local_24);
    if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
      iVar1 = Vec_IntSize(p);
      Vec_IntWriteEntry(p,local_24,iVar1);
      for (local_28 = 0; iVar1 = Abc_ObjFaninNum(pObj_00), local_28 < iVar1; local_28 = local_28 + 1
          ) {
        Vec_IntPush(p,-1);
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkDelayTraceSlackStart( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vSlacks;
    Abc_Obj_t * pObj;
    int i, k;
    vSlacks = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) + Abc_NtkGetTotalFanins(pNtk) );
    Vec_IntFill( vSlacks, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vSlacks, i, Vec_IntSize(vSlacks) );
        for ( k = 0; k < Abc_ObjFaninNum(pObj); k++ )
            Vec_IntPush( vSlacks, -1 );
    }
//    assert( Abc_MaxInt(16, Vec_IntSize(vSlacks)) == Vec_IntCap(vSlacks) );
    return vSlacks;
}